

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O3

void __thiscall
slang::analysis::AnalyzedProcedure::AnalyzedProcedure
          (AnalyzedProcedure *this,AnalysisContext *context,Symbol *analyzedSymbol,
          AnalyzedProcedure *parentProcedure)

{
  vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  *this_00;
  TimingControl **__args_1;
  pointer pEVar1;
  SymbolKind SVar2;
  StatementSyntax *pSVar3;
  ValueSymbol *pVVar4;
  unsigned_long left;
  ulong right;
  ProceduralBlockSymbol *__args_3;
  CallExpression **ppCVar5;
  bool bVar6;
  Statement *pSVar7;
  ClockingBlockSymbol *this_01;
  TimingControl *pTVar8;
  variant_alternative_t<1UL,_variant<const_Statement_*,_const_Expression_*>_> *ppEVar9;
  Type *this_02;
  Type *pTVar10;
  Diagnostic *this_03;
  uint uVar11;
  DiagCode code;
  long lVar12;
  pointer p;
  SubroutineSymbol *subroutine;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *__v;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_04;
  ulong uVar13;
  long lVar14;
  SymbolLSPMap *this_05;
  Symbol *inst;
  const_iterator lit;
  DataFlowAnalysis dfa;
  overlap_iterator local_d70;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *local_d20;
  ProceduralBlockSymbol *local_d18;
  const_iterator local_d10;
  anon_class_24_3_ec3538fa local_cd0;
  const_iterator local_cb8;
  undefined1 local_c78 [2224];
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  local_3c8;
  LValueSymbol *local_398;
  ulong local_390;
  LValueSymbol local_380 [4];
  IntervalMap<unsigned_long,_std::monostate,_3U> *local_140;
  long local_130;
  pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
  *local_120;
  Statement **local_f0;
  Statement *local_d8 [5];
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *local_b0;
  size_type local_a8;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> local_98 [2];
  CallExpression **local_78;
  size_type local_70;
  CallExpression *local_60 [6];
  
  (this->analyzedSymbol).ptr = analyzedSymbol;
  this->parentProcedure = parentProcedure;
  this_00 = &this->assertions;
  this->inferredClock = (TimingControl *)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataFlowAnalysis::DataFlowAnalysis((DataFlowAnalysis *)local_c78,context,analyzedSymbol,true);
  if (analyzedSymbol->kind == ProceduralBlock) {
    pSVar7 = ast::ProceduralBlockSymbol::getBody((ProceduralBlockSymbol *)analyzedSymbol);
  }
  else {
    pSVar7 = ast::SubroutineSymbol::getBody((SubroutineSymbol *)analyzedSymbol);
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
            ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              *)local_c78,pSVar7);
  if (local_c78[0x14] != false) goto LAB_0040072a;
  if (((parentProcedure != (AnalyzedProcedure *)0x0) || (local_a8 != 0)) || (local_70 != 0)) {
    __args_1 = &this->inferredClock;
    if ((analyzedSymbol->kind == ProceduralBlock) && (analyzedSymbol[1].kind != Root)) {
      pTVar8 = DataFlowAnalysis::inferClock((DataFlowAnalysis *)local_c78,parentProcedure);
      *__args_1 = pTVar8;
    }
    else {
      pTVar8 = *__args_1;
    }
    if (pTVar8 == (TimingControl *)0x0) {
      this_01 = (ClockingBlockSymbol *)
                ast::Compilation::getDefaultClocking
                          (analyzedSymbol->parentScope->compilation,analyzedSymbol->parentScope);
      if (this_01 != (ClockingBlockSymbol *)0x0) {
        pTVar8 = ast::ClockingBlockSymbol::getEvent(this_01);
        *__args_1 = pTVar8;
        goto LAB_00400253;
      }
      pTVar8 = *__args_1;
      if (pTVar8 != (TimingControl *)0x0) goto LAB_00400253;
      pTVar8 = (TimingControl *)0x0;
    }
    else {
LAB_00400253:
      if (pTVar8->kind == Invalid) goto LAB_0040072a;
    }
    if (local_a8 != 0) {
      local_d20 = local_b0 + local_a8;
      __v = local_b0;
      local_d18 = (ProceduralBlockSymbol *)analyzedSymbol;
      do {
        __args_3 = local_d18;
        if ((__v == (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)0x0)
           || ((__v->
               super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
               super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
               .
               super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
               .
               super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
               .
               super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
               .
               super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
               ._M_index != '\0')) {
          ppEVar9 = std::get<1ul,slang::ast::Statement_const*,slang::ast::Expression_const*>(__v);
          local_d70.super_iterator.super_const_iterator.map =
               (IntervalMap<unsigned_long,_std::monostate,_3U> *)this;
          std::
          vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
          ::
          emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure*,slang::ast::Symbol_const&,slang::ast::Expression_const&>
                    ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                      *)this_00,context,__args_1,(AnalyzedProcedure **)&local_d70,
                     &__args_3->super_Symbol,*ppEVar9);
        }
        else {
          pSVar7 = *(Statement **)
                    &(__v->
                     super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     ).
                     super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     .
                     super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     .
                     super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     .
                     super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     .
                     super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                     ._M_u;
          if (pSVar7->kind == ProceduralChecker) {
            pSVar3 = pSVar7[1].syntax;
            if (pSVar3 != (StatementSyntax *)0x0) {
              lVar14 = *(long *)(pSVar7 + 1);
              lVar12 = 0;
              do {
                local_d70.super_iterator.super_const_iterator.map =
                     *(IntervalMap<unsigned_long,_std::monostate,_3U> **)(lVar14 + lVar12);
                std::
                vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                ::
                emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,slang::ast::Symbol_const*&>
                          ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                            *)this_00,context,__args_1,this,pSVar7,(Symbol **)&local_d70);
                lVar12 = lVar12 + 8;
              } while ((long)pSVar3 << 3 != lVar12);
            }
          }
          else {
            local_d70.super_iterator.super_const_iterator.map =
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)0x0;
            std::
            vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
            ::
            emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,decltype(nullptr)>
                      ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                        *)this_00,context,__args_1,this,pSVar7,(void **)&local_d70);
          }
        }
        __v = __v + 1;
      } while (__v != local_d20);
      pTVar8 = *__args_1;
      analyzedSymbol = &local_d18->super_Symbol;
    }
    ppCVar5 = local_78;
    if ((pTVar8 == (TimingControl *)0x0) && (local_70 != 0)) {
      lVar14 = 0;
      do {
        ClockInference::checkSampledValueFuncs
                  (context,analyzedSymbol,*(Expression **)((long)ppCVar5 + lVar14));
        lVar14 = lVar14 + 8;
      } while (local_70 << 3 != lVar14);
    }
  }
  SVar2 = (((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).kind;
  if (SVar2 == Subroutine) {
    if ((local_c78[0x408] == true) &&
       (*(int *)((long)&(((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->blocks)._M_ptr +
                4) == 0)) {
      this_02 = ast::DeclaredType::getType
                          ((DeclaredType *)
                           &(((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->super_Symbol)
                            .name);
      pTVar10 = this_02->canonical;
      if (pTVar10 == (Type *)0x0) {
        ast::Type::resolveCanonical(this_02);
        pTVar10 = this_02->canonical;
      }
      if ((((pTVar10->super_Symbol).kind != VoidType) &&
          ((((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).name._M_len != 0)) &&
         (bVar6 = DataFlowAnalysis::isDefinitelyAssigned
                            ((DataFlowAnalysis *)local_c78,
                             (ValueSymbol *)
                             ((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->stmt), !bVar6
         )) {
        code.subsystem = Analysis;
        code.code = 0x15;
        if (local_c78._1720_8_ == 0) {
          bVar6 = DataFlowAnalysis::isReferenced
                            ((DataFlowAnalysis *)local_c78,
                             (ValueSymbol *)
                             ((ProceduralBlockSymbol *)((long)analyzedSymbol + 0x70))->stmt);
          code = (DiagCode)((uint)!bVar6 << 0x11 | 0x15000e);
        }
        this_03 = AnalysisContext::addDiag
                            (context,analyzedSymbol,code,
                             (((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).location);
        Diagnostic::operator<<
                  (this_03,(((ProceduralBlockSymbol *)analyzedSymbol)->super_Symbol).name);
      }
    }
  }
  else if (((SVar2 == ProceduralBlock) &&
           (((ProceduralBlockSymbol *)analyzedSymbol)->procedureKind == AlwaysComb)) &&
          (local_cd0.dfa = (DataFlowAnalysis *)local_c78, local_cd0.context = context,
          local_cd0.procedure = (ProceduralBlockSymbol *)analyzedSymbol, local_390 != 0)) {
    pEVar1 = (pointer)((long)&local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18);
    uVar13 = 0;
    do {
      pVVar4 = local_398[uVar13].symbol.ptr;
      uVar11 = (pVVar4->super_Symbol).kind - Variable;
      if (((0x18 < uVar11) || ((0x1800c0fU >> (uVar11 & 0x1f) & 1) == 0)) ||
         (pVVar4[1].super_Symbol.kind != Unknown)) {
        this_05 = &local_398[uVar13].assigned;
        if (uVar13 < (ulong)local_c78._888_8_) {
          this_04 = (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                    (local_c78._880_8_ + uVar13 * 0x40);
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin(&local_d10,this_05);
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                      ((const_iterator *)&local_d70,this_05);
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_d10.path,&local_d70.super_iterator.super_const_iterator.path);
            if (local_d70.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ != pEVar1) {
              operator_delete(local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar6) break;
            lVar14 = (ulong)local_d10.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                            [local_d10.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                            offset * 0x10;
            left = *(unsigned_long *)
                    ((long)local_d10.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                           [local_d10.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                           node + lVar14);
            right = *(ulong *)((long)local_d10.path.path.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     data_[local_d10.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .len - 1].node + lVar14 + 8);
            IntervalMap<unsigned_long,_std::monostate,_3U>::find(&local_d70,this_04,left,right);
            IntervalMap<unsigned_long,_std::monostate,_3U>::end(&local_cb8,this_04);
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_d70.super_iterator.super_const_iterator.path,&local_cb8.path);
            if (local_cb8.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_cb8.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_cb8.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar6) {
LAB_00400512:
              bVar6 = true;
            }
            else {
              lVar14 = (ulong)local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_d70.super_iterator.super_const_iterator.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].offset * 0x10;
              if ((left < *(ulong *)((long)local_d70.super_iterator.super_const_iterator.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .data_[local_d70.super_iterator.super_const_iterator.path
                                                  .path.
                                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                                  .len - 1].node + lVar14)) ||
                 (*(ulong *)((long)local_d70.super_iterator.super_const_iterator.path.path.
                                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                   data_[local_d70.super_iterator.super_const_iterator.path.path.
                                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                         .len - 1].node + lVar14 + 8) < right)) goto LAB_00400512;
              bVar6 = false;
            }
            if (local_d70.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ != pEVar1) {
              operator_delete(local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar6) {
              lVar14 = 0x50;
              if ((local_d10.map)->height != 0) {
                lVar14 = 0x80;
              }
              AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                        (&local_cd0,
                         *(Symbol **)
                          ((long)(local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_ + -1)
                                 [local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len]
                                 .node +
                          (ulong)(local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_ + -1)
                                 [local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len]
                                 .offset * 8 + lVar14),
                         (Expression *)
                         (local_d10.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len * 0x10))
              ;
            }
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
            operator++(&local_d10);
          }
          p = local_d10.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
              data_;
          if (local_d10.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
              data_ != (pointer)local_d10.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                firstElement) {
LAB_00400641:
            operator_delete(p);
          }
        }
        else {
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
                    ((const_iterator *)&local_d70,this_05);
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end(&local_d10,this_05);
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_d70.super_iterator.super_const_iterator.path,&local_d10.path);
            if (local_d10.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_d10.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_d10.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar6) break;
            lVar14 = 0x50;
            if (local_d70.super_iterator.super_const_iterator.map[1].height != 0) {
              lVar14 = 0x80;
            }
            AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                      (&local_cd0,
                       *(Symbol **)
                        ((long)local_d70.super_iterator.super_const_iterator.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               [local_d70.super_iterator.super_const_iterator.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
                                1].node +
                        (long)(ulong)local_d70.super_iterator.super_const_iterator.path.path.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     data_[local_d70.super_iterator.super_const_iterator.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .len - 1].offset * 8 + lVar14),
                       (Expression *)
                       (ulong)local_d70.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_d70.super_iterator.super_const_iterator.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].offset);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
            operator++((const_iterator *)&local_d70);
          }
          p = local_d70.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
          if (local_d70.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ != pEVar1)
          goto LAB_00400641;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_390);
  }
LAB_0040072a:
  if (local_78 != local_60) {
    operator_delete(local_78);
  }
  if (local_b0 != local_98) {
    operator_delete(local_b0);
  }
  if (local_f0 != local_d8) {
    operator_delete(local_f0);
  }
  local_d70.super_iterator.super_const_iterator.map = local_140;
  if (local_120 !=
      (pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
       *)0x0) {
    detail::hashing::
    StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>
                  *)&local_d70,local_120,(local_130 * 0x448 + 0x456U) / 0x48);
  }
  if (local_398 != local_380) {
    operator_delete(local_398);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  ::delete_((allocator_type)local_c78._2216_8_,&local_3c8);
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  ~AbstractFlowAnalysis
            ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              *)local_c78);
  return;
}

Assistant:

AnalyzedProcedure::AnalyzedProcedure(AnalysisContext& context, const Symbol& analyzedSymbol,
                                     const AnalyzedProcedure* parentProcedure) :
    analyzedSymbol(&analyzedSymbol), parentProcedure(parentProcedure) {

    DataFlowAnalysis dfa(context, analyzedSymbol, true);
    switch (analyzedSymbol.kind) {
        case SymbolKind::ProceduralBlock:
            dfa.run(analyzedSymbol.as<ProceduralBlockSymbol>().getBody());
            break;
        case SymbolKind::Subroutine:
            dfa.run(analyzedSymbol.as<SubroutineSymbol>().getBody());
            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (dfa.bad)
        return;

    if (parentProcedure || !dfa.getAssertions().empty() || !dfa.getSampledValueCalls().empty()) {
        // All flavors of always and initial blocks can infer a clock.
        if (analyzedSymbol.kind == SymbolKind::ProceduralBlock &&
            analyzedSymbol.as<ProceduralBlockSymbol>().procedureKind !=
                ProceduralBlockKind::Final) {
            inferredClock = dfa.inferClock(parentProcedure);
        }

        // If no procedural inferred clock, check the scope for a default clocking block.
        if (!inferredClock) {
            auto scope = analyzedSymbol.getParentScope();
            SLANG_ASSERT(scope);

            if (auto defaultClocking = scope->getCompilation().getDefaultClocking(*scope))
                inferredClock = &defaultClocking->as<ClockingBlockSymbol>().getEvent();
        }

        if (inferredClock && inferredClock->bad())
            return;

        for (auto& var : dfa.getAssertions()) {
            if (auto stmtPtr = std::get_if<const Statement*>(&var)) {
                auto& stmt = **stmtPtr;
                if (stmt.kind == StatementKind::ProceduralChecker) {
                    for (auto inst : stmt.as<ProceduralCheckerStatement>().instances)
                        assertions.emplace_back(context, inferredClock, *this, stmt, inst);
                }
                else {
                    assertions.emplace_back(context, inferredClock, *this, stmt, nullptr);
                }
            }
            else {
                auto& expr = *std::get<const Expression*>(var);
                assertions.emplace_back(context, inferredClock, this, analyzedSymbol, expr);
            }
        }

        // If we have no inferred clock then all sampled value system calls must provide
        // a clocking argument explicitly.
        if (!inferredClock) {
            for (auto call : dfa.getSampledValueCalls())
                ClockInference::checkSampledValueFuncs(context, analyzedSymbol, *call);
        }
    }

    if (analyzedSymbol.kind == SymbolKind::ProceduralBlock) {
        auto& procedure = analyzedSymbol.as<ProceduralBlockSymbol>();
        if (procedure.procedureKind == ProceduralBlockKind::AlwaysComb) {
            dfa.visitLatches([&](const Symbol&, const Expression& expr) {
                FormatBuffer buffer;
                stringifyLSP(expr, dfa.getEvalContext(), buffer);

                context.addDiag(procedure, diag::InferredLatch, expr.sourceRange) << buffer.str();
            });
        }
    }
    else if (analyzedSymbol.kind == SymbolKind::Subroutine) {
        // Diagnose missing return statements and/or incomplete
        // assignments to the return value var.
        auto& subroutine = analyzedSymbol.as<SubroutineSymbol>();
        if (dfa.isReachable() && subroutine.subroutineKind == SubroutineKind::Function &&
            !subroutine.getReturnType().isVoid() && !subroutine.name.empty()) {

            // Control falls off the end of a non-void function but that is
            // fine if the return value var is definitely assigned here.
            SLANG_ASSERT(subroutine.returnValVar);
            if (!dfa.isDefinitelyAssigned(*subroutine.returnValVar)) {
                if (dfa.hasReturnStatements() || dfa.isReferenced(*subroutine.returnValVar)) {
                    context.addDiag(subroutine, diag::IncompleteReturn, subroutine.location)
                        << subroutine.name;
                }
                else {
                    context.addDiag(subroutine, diag::MissingReturn, subroutine.location)
                        << subroutine.name;
                }
            }
        }
    }
}